

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::endModule(SymbolData *this,AssemblerFile *file)

{
  reference pvVar1;
  AssemblerFile *file_local;
  SymbolData *this_local;
  
  pvVar1 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                     (&this->modules,(long)this->currentModule);
  if (pvVar1->file == file) {
    if (this->currentModule == 0) {
      Logger::printError<>(Error,"No module opened");
    }
    else {
      if (this->currentFunction != -1) {
        Logger::printError<>(Error,"Module closed before function end");
        this->currentFunction = -1;
      }
      this->currentModule = 0;
    }
  }
  return;
}

Assistant:

void SymbolData::endModule(AssemblerFile* file)
{
	if (modules[currentModule].file != file)
		return;

	if (currentModule == 0)
	{
		Logger::printError(Logger::Error, "No module opened");
		return;
	}

	if (currentFunction != -1)
	{
		Logger::printError(Logger::Error, "Module closed before function end");
		currentFunction = -1;
	}

	currentModule = 0;
}